

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

void duckdb::Time::Convert(dtime_t dtime,int32_t *hour,int32_t *min,int32_t *sec,int32_t *micros)

{
  int iVar1;
  long lVar2;
  int64_t time;
  
  iVar1 = (int)(dtime.micros / 3600000000);
  *hour = iVar1;
  lVar2 = (long)iVar1 * -3600000000 + dtime.micros;
  iVar1 = (int)(lVar2 / 60000000);
  *min = iVar1;
  lVar2 = (long)iVar1 * -60000000 + lVar2;
  iVar1 = (int)(lVar2 / 1000000);
  *sec = iVar1;
  *micros = (int)lVar2 + iVar1 * -1000000;
  return;
}

Assistant:

void Time::Convert(dtime_t dtime, int32_t &hour, int32_t &min, int32_t &sec, int32_t &micros) {
	int64_t time = dtime.micros;
	hour = int32_t(time / Interval::MICROS_PER_HOUR);
	time -= int64_t(hour) * Interval::MICROS_PER_HOUR;
	min = int32_t(time / Interval::MICROS_PER_MINUTE);
	time -= int64_t(min) * Interval::MICROS_PER_MINUTE;
	sec = int32_t(time / Interval::MICROS_PER_SEC);
	time -= int64_t(sec) * Interval::MICROS_PER_SEC;
	micros = int32_t(time);
	D_ASSERT(Time::IsValidTime(hour, min, sec, micros));
}